

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbopacking64.h
# Opt level: O3

void packforblock6_64(uint64_t base,uint64_t **pin,uint8_t **pw)

{
  ulong *puVar1;
  uint64_t *puVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  uint64_t uVar14;
  uint64_t uVar15;
  uint64_t uVar16;
  uint64_t uVar17;
  uint64_t uVar18;
  uint64_t uVar19;
  uint64_t uVar20;
  uint64_t uVar21;
  uint64_t uVar22;
  uint64_t uVar23;
  uint64_t uVar24;
  int iVar25;
  
  iVar25 = (int)base;
  puVar1 = (ulong *)*pw;
  puVar2 = *pin;
  uVar3 = puVar2[10];
  uVar4 = puVar2[0xb];
  uVar5 = puVar2[0xc];
  uVar6 = puVar2[0xd];
  uVar7 = puVar2[0xe];
  uVar8 = puVar2[0xf];
  uVar15 = puVar2[0x10];
  uVar16 = puVar2[0x11];
  uVar17 = puVar2[0x12];
  uVar18 = puVar2[0x13];
  uVar19 = puVar2[0x14];
  uVar9 = puVar2[0x15];
  uVar10 = puVar2[0x16];
  uVar11 = puVar2[0x17];
  uVar12 = puVar2[0x18];
  uVar13 = puVar2[0x19];
  uVar14 = puVar2[0x1a];
  uVar20 = puVar2[0x1b];
  uVar21 = puVar2[0x1c];
  uVar22 = puVar2[0x1d];
  uVar23 = puVar2[0x1e];
  uVar24 = puVar2[0x1f];
  *puVar1 = uVar3 - base << 0x3c |
            (ulong)(uint)((int)puVar2[9] - iVar25) << 0x36 |
            (ulong)(uint)((int)puVar2[8] - iVar25) << 0x30 |
            (ulong)(uint)((int)puVar2[7] - iVar25) << 0x2a |
            (ulong)(uint)((int)puVar2[6] - iVar25) << 0x24 |
            (puVar2[5] - base) * 0x40000000 | (puVar2[4] - base) * 0x1000000 |
            (puVar2[3] - base) * 0x40000 | (puVar2[2] - base) * 0x1000 |
            (puVar2[1] - base) * 0x40 | *puVar2 - base;
  puVar1[1] = uVar9 - base << 0x3e |
              (ulong)(uint)((int)uVar19 - iVar25) << 0x38 |
              (ulong)(uint)((int)uVar18 - iVar25) << 0x32 |
              (ulong)(uint)((int)uVar17 - iVar25) << 0x2c |
              (ulong)(uint)((int)uVar16 - iVar25) << 0x26 |
              (ulong)(uint)((int)uVar15 - iVar25) << 0x20 |
              (uVar8 - base) * 0x4000000 | (uVar7 - base) * 0x100000 |
              (uVar6 - base) * 0x4000 | (uVar5 - base) * 0x100 |
              (uVar4 - base) * 4 | uVar3 - base >> 4;
  puVar1[2] = (ulong)(uint)((int)uVar24 - iVar25) << 0x3a |
              (ulong)(uint)((int)uVar23 - iVar25) << 0x34 |
              (ulong)(uint)((int)uVar22 - iVar25) << 0x2e |
              (ulong)(uint)((int)uVar21 - iVar25) << 0x28 |
              (ulong)(uint)((int)uVar20 - iVar25) << 0x22 |
              (uVar14 - base) * 0x10000000 | (uVar13 - base) * 0x400000 |
              (uVar12 - base) * 0x10000 | (uVar11 - base) * 0x400 |
              (uVar10 - base) * 0x10 | uVar9 - base >> 2;
  *pin = puVar2 + 0x20;
  *pw = *pw + 0x18;
  return;
}

Assistant:

static void packforblock6_64(const uint64_t base, const uint64_t ** pin, uint8_t ** pw) {
  uint64_t * pw64 = *(uint64_t **) pw;
  const uint64_t * in = *pin;
  /* we are going to touch  3 64-bit words */ 
  uint64_t w0;
  uint64_t w1;
  uint64_t w2;
  w0 = (in[0] - base);
  w0 |=  (in[1] - base) << 6;
  w0 |=  (in[2] - base) << 12;
  w0 |=  (in[3] - base) << 18;
  w0 |=  (in[4] - base) << 24;
  w0 |=  (in[5] - base) << 30;
  w0 |=  (in[6] - base) << 36;
  w0 |=  (in[7] - base) << 42;
  w0 |=  (in[8] - base) << 48;
  w0 |=  (in[9] - base) << 54;
  w0 |= (in[10] - base) << 60;
  w1 = (in[10] - base) >> 4;
  w1 |=  (in[11] - base) << 2;
  w1 |=  (in[12] - base) << 8;
  w1 |=  (in[13] - base) << 14;
  w1 |=  (in[14] - base) << 20;
  w1 |=  (in[15] - base) << 26;
  w1 |=  (in[16] - base) << 32;
  w1 |=  (in[17] - base) << 38;
  w1 |=  (in[18] - base) << 44;
  w1 |=  (in[19] - base) << 50;
  w1 |=  (in[20] - base) << 56;
  w1 |= (in[21] - base) << 62;
  w2 = (in[21] - base) >> 2;
  w2 |=  (in[22] - base) << 4;
  w2 |=  (in[23] - base) << 10;
  w2 |=  (in[24] - base) << 16;
  w2 |=  (in[25] - base) << 22;
  w2 |=  (in[26] - base) << 28;
  w2 |=  (in[27] - base) << 34;
  w2 |=  (in[28] - base) << 40;
  w2 |=  (in[29] - base) << 46;
  w2 |=  (in[30] - base) << 52;
  w2 |=  (in[31] - base) << 58;
  pw64[0] = w0;
  pw64[1] = w1;
  pw64[2] = w2;
  *pin += 32; /* we consumed 32 64-bit integers */ 
  *pw += 24; /* we used up 24 output bytes */ 
}